

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_descriptor.h
# Opt level: O3

FormatDescriptor *
ktx::createFormatDescriptor(FormatDescriptor *__return_storage_ptr__,uint32_t *dfd)

{
  byte bVar1;
  void *pvVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  basicDescriptor basic;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> samples;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> local_88;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  FormatDescriptor *local_50;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> local_48;
  
  uVar15 = dfd[4];
  uVar7 = dfd[6];
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_finish = (sample *)0x0;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (sample *)0x0;
  if ((dfd[2] >> 0x12) - 6 < 4) {
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (sample *)0x0;
    uVar13 = (ulong)dfd[3];
    uVar4 = (ulong)dfd[5];
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  }
  else {
    lVar14 = 9;
    uVar13 = 0;
    local_70 = (ulong)dfd[3];
    local_68 = (ulong)dfd[5];
    local_60 = (ulong)uVar7;
    local_58 = (ulong)uVar15;
    local_50 = __return_storage_ptr__;
    do {
      if (local_88.
          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
        _M_realloc_insert<>(&local_88,
                            (iterator)
                            local_88.
                            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        *(undefined8 *)
         local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_finish = 0;
        (local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_finish)->lower = 0;
        (local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_finish)->upper = 0;
        local_88.
        super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = dfd[lVar14 + -2];
      uVar8 = CONCAT62((int6)((ulong)*(undefined8 *)
                                      (local_88.
                                       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + -1) >> 0x10),
                       (short)uVar3);
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) = uVar8;
      bVar1 = *(byte *)((long)dfd + lVar14 * 4 + -6);
      uVar4 = (ulong)bVar1 << 0x10;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar8 & 0xffffffffff00ffff | uVar4;
      uVar5 = (ulong)(dfd[lVar14 + -2] & 0xf000000);
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar8 & 0xfffffffff000ffff | uVar4 | uVar5;
      uVar15 = dfd[lVar14 + -2];
      uVar16 = (ulong)(uVar15 & 0x80000000);
      uVar17 = (ulong)(uVar15 & 0x40000000);
      uVar9 = (ulong)(uVar15 & 0x20000000);
      uVar6 = (ulong)(uVar15 & 0x10000000);
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar6 | uVar9 | uVar17 | uVar8 & 0xffffffff0000ffff | uVar4 | uVar5 | uVar16;
      uVar10 = (ulong)(byte)dfd[lVar14 + -1] << 0x20;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar6 | uVar9 | uVar17 | uVar8 & 0xffffff000000ffff | uVar4 | uVar5 | uVar16 | uVar10;
      uVar11 = (ulong)*(byte *)((long)dfd + lVar14 * 4 + -3) << 0x28;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar6 | uVar9 | uVar17 | uVar8 & 0xffff00000000ffff | uVar4 | uVar5 | uVar16 | uVar10 |
           uVar11;
      uVar12 = (ulong)*(byte *)((long)dfd + lVar14 * 4 + -2) << 0x30;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar6 | uVar9 | uVar17 | uVar8 & 0xff0000000000ffff | uVar4 | uVar5 | uVar16 | uVar10 |
           uVar11 | uVar12;
      *(ulong *)(local_88.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1) =
           uVar6 | uVar9 | uVar17 | CONCAT12(bVar1,(short)uVar3) | uVar5 | uVar16 | uVar10 | uVar11
           | uVar12 | (ulong)*(byte *)((long)dfd + lVar14 * 4 + -1) << 0x38;
      local_88.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].lower =
           dfd[(ulong)((uint)lVar14 - 1 & 0xfffffffc) + 1];
      local_88.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].upper =
           dfd[(ulong)((uint)lVar14 & 0xfffffffd) + 1];
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 4;
    } while (uVar13 < (dfd[2] >> 0x12) - 6 >> 2);
    uVar15 = (uint)local_58;
    uVar7 = (uint)local_60;
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__ = local_50;
    uVar13 = local_70;
    uVar4 = local_68;
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
         local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_start._0_4_;
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ =
         local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_start._4_4_;
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_finish._0_4_;
    local_48.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         local_88.
         super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
         _M_impl.super__Vector_impl_data._M_finish._4_4_;
  }
  basic._0_8_ = (ulong)(uVar15 >> 0x18) << 0x38 |
                (ulong)(uVar15 >> 0x10 & 0xff) << 0x30 |
                (ulong)(uVar15 >> 8 & 0xff) << 0x28 | (ulong)(uVar15 & 0xff) << 0x20 | uVar13;
  basic._8_8_ = (ulong)(uVar7 >> 0x18) << 0x38 |
                (ulong)(uVar7 >> 0x10 & 0xff) << 0x30 |
                (ulong)(uVar7 >> 8 & 0xff) << 0x28 | (ulong)(uVar7 & 0xff) << 0x20 | uVar4;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FormatDescriptor::FormatDescriptor(__return_storage_ptr__,basic,&local_48);
  pvVar2 = (void *)CONCAT44(local_48.
                            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_48.
                            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_48.
                                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  if (local_88.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline FormatDescriptor createFormatDescriptor(const uint32_t* dfd) {
    const auto* bdfd = dfd + 1;

    FormatDescriptor::basicDescriptor basic;
    basic.colorModel = khr_df_model_e(KHR_DFDVAL(bdfd, MODEL));
    basic.colorPrimaries = khr_df_primaries_e(KHR_DFDVAL(bdfd, PRIMARIES));
    basic.transferFunction = khr_df_transfer_e(KHR_DFDVAL(bdfd, TRANSFER));
    basic.dataFlags = khr_df_flags_e(KHR_DFDVAL(bdfd, FLAGS));
    basic.texelBlockDimension0 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION0);
    basic.texelBlockDimension1 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION1);
    basic.texelBlockDimension2 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION2);
    basic.texelBlockDimension3 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION3);
    basic.bytesPlane0 = KHR_DFDVAL(bdfd, BYTESPLANE0);
    basic.bytesPlane1 = KHR_DFDVAL(bdfd, BYTESPLANE1);
    basic.bytesPlane2 = KHR_DFDVAL(bdfd, BYTESPLANE2);
    basic.bytesPlane3 = KHR_DFDVAL(bdfd, BYTESPLANE3);
    basic.bytesPlane4 = KHR_DFDVAL(bdfd, BYTESPLANE4);
    basic.bytesPlane5 = KHR_DFDVAL(bdfd, BYTESPLANE5);
    basic.bytesPlane6 = KHR_DFDVAL(bdfd, BYTESPLANE6);
    basic.bytesPlane7 = KHR_DFDVAL(bdfd, BYTESPLANE7);

    std::vector<FormatDescriptor::sample> samples;
    for (uint32_t i = 0; i < KHR_DFDSAMPLECOUNT(bdfd); ++i) {
        auto& sample = samples.emplace_back();
        sample.bitOffset = KHR_DFDSVAL(bdfd, i, BITOFFSET);
        sample.bitLength = KHR_DFDSVAL(bdfd, i, BITLENGTH);
        sample.channelType = KHR_DFDSVAL(bdfd, i, CHANNELID);
        const auto dataType = KHR_DFDSVAL(bdfd, i, QUALIFIERS);
        sample.qualifierFloat = (dataType & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;
        sample.qualifierSigned = (dataType & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
        sample.qualifierExponent = (dataType & KHR_DF_SAMPLE_DATATYPE_EXPONENT) != 0;
        sample.qualifierLinear = (dataType & KHR_DF_SAMPLE_DATATYPE_LINEAR) != 0;
        sample.samplePosition0 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION0);
        sample.samplePosition1 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION1);
        sample.samplePosition2 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION2);
        sample.samplePosition3 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION3);
        sample.lower = KHR_DFDSVAL(bdfd, i, SAMPLELOWER);
        sample.upper = KHR_DFDSVAL(bdfd, i, SAMPLEUPPER);
    }

    return FormatDescriptor{basic, std::move(samples)};
}